

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2ModDel::renderChan(V2ModDel *this,StereoSample *chanbuf,int nsamples)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (((this->wetout != 0.0) || (NAN(this->wetout))) && (0 < nsamples)) {
    fVar1 = this->dryout;
    uVar7 = this->mcnt;
    uVar6 = this->dbufmask;
    uVar5 = this->dbptr;
    uVar3 = 0;
    do {
      fVar11 = chanbuf[uVar3].field_0.l + 3.8146973e-06;
      fVar10 = *(float *)((long)chanbuf + uVar3 * 8 + 4);
      uVar9 = (ulong)this->mmaxoffs * (ulong)((int)uVar7 >> 0x1f ^ uVar7 * 2);
      iVar4 = (int)(uVar9 >> 0x20) + this->dboffs[0];
      pfVar2 = this->db[0];
      fVar12 = (pfVar2[(uVar5 - iVar4) - 1 & uVar6] - pfVar2[uVar5 - iVar4 & uVar6]) *
               ((float)((uint)(uVar9 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               pfVar2[uVar5 - iVar4 & uVar6];
      pfVar2[uVar5] = this->fbval * fVar12 + fVar11;
      chanbuf[uVar3].field_0.l = fVar11 * fVar1 + fVar12 * this->wetout;
      iVar4 = this->mphase + this->mcnt;
      fVar10 = fVar10 + 3.8146973e-06;
      uVar9 = (ulong)this->mmaxoffs * (ulong)(uint)(iVar4 >> 0x1f ^ iVar4 * 2);
      uVar8 = this->dbptr - ((int)(uVar9 >> 0x20) + this->dboffs[1]);
      pfVar2 = this->db[1];
      fVar11 = (pfVar2[uVar8 - 1 & this->dbufmask] - pfVar2[uVar8 & this->dbufmask]) *
               ((float)((uint)(uVar9 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
               pfVar2[uVar8 & this->dbufmask];
      pfVar2[this->dbptr] = this->fbval * fVar11 + fVar10;
      *(float *)((long)chanbuf + uVar3 * 8 + 4) = fVar10 * fVar1 + fVar11 * this->wetout;
      uVar7 = this->mcnt + this->mfreq;
      this->mcnt = uVar7;
      uVar6 = this->dbufmask;
      uVar5 = this->dbptr + 1 & uVar6;
      this->dbptr = uVar5;
      uVar3 = uVar3 + 1;
    } while ((uint)nsamples != uVar3);
  }
  return;
}

Assistant:

void renderChan(StereoSample *chanbuf, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL chan");

        float dry = dryout;
        for (int i=0; i < nsamples; i++)
            processSample(&chanbuf[i], chanbuf[i].l + fcdcoffset, chanbuf[i].r + fcdcoffset, dry);
    }